

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

Vec_Int_t * Cba_NtkCollectOutFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  Cba_ObjType_t CVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  Vec_Bit_t *p_02;
  int iVar5;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_BitStart((p->vObjType).nSize);
  p_02 = Vec_BitStart((p->vFonObj).nSize);
  for (iVar5 = 0; iVar5 < vObjs->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar5);
    Vec_BitWriteEntry(p_01,iVar1,1);
  }
  for (iVar5 = 1; iVar5 < (p->vObjType).nSize; iVar5 = iVar5 + 1) {
    CVar2 = Cba_ObjType(p,iVar5);
    if (CVar2 != CBA_OBJ_NONE) {
      iVar1 = Vec_BitEntry(p_01,iVar5);
      if (iVar1 == 0) {
        iVar1 = Cba_ObjFin0(p,iVar5);
        while( true ) {
          iVar3 = Cba_ObjFin0(p,iVar5 + 1);
          if (iVar3 <= iVar1) break;
          iVar3 = Cba_FinFon(p,iVar1);
          if (0 < iVar3) {
            Vec_BitWriteEntry(p_02,iVar3,1);
          }
          iVar1 = iVar1 + 1;
        }
      }
    }
  }
  for (iVar5 = 0; iVar5 < vObjs->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vObjs,iVar5);
    iVar3 = Cba_ObjFon0(p,iVar1);
    while( true ) {
      iVar4 = Cba_ObjFon0(p,iVar1 + 1);
      if (iVar4 <= iVar3) break;
      iVar4 = Vec_BitEntry(p_02,iVar3);
      if (iVar4 != 0) {
        Vec_IntPush(p_00,iVar3);
      }
      iVar3 = iVar3 + 1;
    }
  }
  Vec_BitFree(p_01);
  Vec_BitFree(p_02);
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectOutFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vMapObjs = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon;
    // map objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Vec_BitWriteEntry( vMapObjs, iObj, 1 );
    // mark those used by non-objects
    Cba_NtkForEachObj( p, iObj )
        if ( !Vec_BitEntry(vMapObjs, iObj) )
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                if ( iFon > 0 )
                    Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // collect pointed fons among those in objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            if ( Vec_BitEntry(vVisFons, iFon) )
                Vec_IntPush( vFons, iFon );
    Vec_BitFree( vMapObjs );
    Vec_BitFree( vVisFons );
    return vFons;
}